

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strength_reduction_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::StrengthReductionPass::FindIntTypesAndConstants(StrengthReductionPass *this)

{
  Instruction *this_00;
  uint32_t uVar1;
  uint32_t uVar2;
  TypeManager *pTVar3;
  Module *pMVar4;
  Instruction **ppIVar5;
  Integer uint32;
  Integer int32;
  
  int32.super_Type.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  int32.super_Type.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  int32.super_Type.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  int32.super_Type.kind_ = kInteger;
  int32.super_Type._36_4_ = 0x20;
  int32.super_Type._vptr_Type = (_func_int **)&PTR__Type_003b18d0;
  int32.signed_ = true;
  pTVar3 = IRContext::get_type_mgr((this->super_Pass).context_);
  uVar1 = analysis::TypeManager::GetId(pTVar3,&int32.super_Type);
  *(uint32_t *)&(this->super_Pass).field_0x34 = uVar1;
  uint32.super_Type.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  uint32.super_Type.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uint32.super_Type.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uint32.super_Type.kind_ = kInteger;
  uint32.super_Type._36_4_ = 0x20;
  uint32.super_Type._vptr_Type = (_func_int **)&PTR__Type_003b18d0;
  uint32.signed_ = false;
  pTVar3 = IRContext::get_type_mgr((this->super_Pass).context_);
  uVar1 = analysis::TypeManager::GetId(pTVar3,&uint32.super_Type);
  this->uint32_type_id_ = uVar1;
  pMVar4 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  ppIVar5 = (Instruction **)
            ((long)&(pMVar4->types_values_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  while (this_00 = *ppIVar5,
        this_00 !=
        &(pMVar4->types_values_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_) {
    if (this_00->opcode_ == OpConstant) {
      uVar1 = Instruction::type_id(this_00);
      if (uVar1 == this->uint32_type_id_) {
        uVar1 = Instruction::GetSingleWordOperand(this_00,2);
        if (uVar1 < 0x21) {
          uVar2 = Instruction::result_id(this_00);
          this->constant_ids_[uVar1] = uVar2;
        }
      }
    }
    pMVar4 = (((this->super_Pass).context_)->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    ppIVar5 = &(this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  }
  analysis::Type::~Type(&uint32.super_Type);
  analysis::Type::~Type(&int32.super_Type);
  return;
}

Assistant:

void StrengthReductionPass::FindIntTypesAndConstants() {
  analysis::Integer int32(32, true);
  int32_type_id_ = context()->get_type_mgr()->GetId(&int32);
  analysis::Integer uint32(32, false);
  uint32_type_id_ = context()->get_type_mgr()->GetId(&uint32);
  for (auto iter = get_module()->types_values_begin();
       iter != get_module()->types_values_end(); ++iter) {
    switch (iter->opcode()) {
      case spv::Op::OpConstant:
        if (iter->type_id() == uint32_type_id_) {
          uint32_t value = iter->GetSingleWordOperand(2);
          if (value <= 32) constant_ids_[value] = iter->result_id();
        }
        break;
      default:
        break;
    }
  }
}